

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall QMdiSubWindowPrivate::updateInternalWindowTitle(QMdiSubWindowPrivate *this)

{
  int iVar1;
  int iVar2;
  QWidget *this_00;
  QArrayData *pQVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  int iVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QLatin1String QVar9;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar6 = QWidget::isWindowModified(this_00);
  if (bVar6) {
    QWidget::windowTitle(&local_48,this_00);
    pQVar3 = &((this->windowTitle).d.d)->super_QArrayData;
    pcVar4 = (this->windowTitle).d.ptr;
    (this->windowTitle).d.d = local_48.d.d;
    (this->windowTitle).d.ptr = local_48.d.ptr;
    qVar5 = (this->windowTitle).d.size;
    (this->windowTitle).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar3;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QVar8.m_data = (char *)0x1;
    QVar8.m_size = (qsizetype)"[*]";
    QVar9.m_data = (char *)0x3;
    QVar9.m_size = (qsizetype)&this->windowTitle;
    QString::replace(QVar9,QVar8,0x66910e);
  }
  else {
    QWidget::windowTitle(&local_60,this_00);
    qt_setWindowTitle_helperHelper(&local_48,&local_60,this_00);
    pQVar3 = &((this->windowTitle).d.d)->super_QArrayData;
    pcVar4 = (this->windowTitle).d.ptr;
    (this->windowTitle).d.d = local_48.d.d;
    (this->windowTitle).d.ptr = local_48.d.ptr;
    qVar5 = (this->windowTitle).d.size;
    (this->windowTitle).d.size = local_48.d.size;
    local_48.d.d = (Data *)pQVar3;
    local_48.d.ptr = pcVar4;
    local_48.d.size = qVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar1 = (this_00->data->crect).x2.m_i;
  iVar2 = (this_00->data->crect).x1.m_i;
  iVar7 = titleBarHeight(this);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (char16_t *)CONCAT44(iVar7 + -1,iVar1 - iVar2);
  QWidget::update(this_00,(QRect *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::updateInternalWindowTitle()
{
    Q_Q(QMdiSubWindow);
    if (q->isWindowModified()) {
        windowTitle = q->windowTitle();
        windowTitle.replace("[*]"_L1, "*"_L1);
    } else {
        windowTitle = qt_setWindowTitle_helperHelper(q->windowTitle(), q);
    }
    q->update(0, 0, q->width(), titleBarHeight());
}